

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

double __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<long>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<long> *accessor)

{
  DataChunk *pDVar1;
  CURSOR *pCVar2;
  duckdb *pdVar3;
  bool bVar4;
  bool bVar5;
  reference pvVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double result_1;
  double local_60;
  string local_58;
  double local_38;
  
  pCVar2 = accessor->data;
  bVar4 = (pCVar2->scan).next_row_index <= lidx;
  bVar5 = lidx < (pCVar2->scan).current_row_index;
  if (lidx == hidx) {
    if (bVar5 || bVar4) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (long *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar2->validity = &pvVar6->validity;
    }
    pdVar3 = (duckdb *)pCVar2->data[(uint)((int)lidx - (int)(pCVar2->scan).current_row_index)];
    bVar5 = TryCast::Operation<long,double>((int64_t)pdVar3,&local_60,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,double>(&local_58,pdVar3,auVar8._8_8_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_58);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    if (bVar5 || bVar4) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (long *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar2->validity = &pvVar6->validity;
    }
    pdVar3 = (duckdb *)pCVar2->data[(uint)((int)lidx - (int)(pCVar2->scan).current_row_index)];
    bVar5 = TryCast::Operation<long,double>((int64_t)pdVar3,&local_60,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,double>(&local_58,pdVar3,auVar8._8_8_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_58);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_38 = local_60;
    pCVar2 = accessor->data;
    if (((pCVar2->scan).next_row_index <= hidx) || (hidx < (pCVar2->scan).current_row_index)) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,hidx,&pCVar2->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (long *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar2->validity = &pvVar6->validity;
    }
    pdVar3 = (duckdb *)pCVar2->data[(uint)((int)hidx - (int)(pCVar2->scan).current_row_index)];
    bVar5 = TryCast::Operation<long,double>((int64_t)pdVar3,&local_60,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,double>(&local_58,pdVar3,auVar8._8_8_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_58);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    dVar7 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_60 = dVar7 * local_60 + local_38 * (1.0 - dVar7);
  }
  return local_60;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}